

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
CMU462::Application::dragSelection
          (Application *this,float x,float y,float dx,float dy,Matrix4x4 *modelViewProj)

{
  undefined8 uVar1;
  long *plVar2;
  undefined8 in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  
  if (*(long *)(*(long *)(in_RDI + 0x50) + 0x30) != 0) {
    uVar1 = *(undefined8 *)(in_RDI + 0x220);
    auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._12_4_ = DAT_0030e0c0._4_4_;
    fVar3 = (float)((double)in_XMM2_Da *
                   (2.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44((int)DAT_0030e0c0,(int)uVar1) - 4503599627370496.0))));
    uVar1 = *(undefined8 *)(in_RDI + 0x228);
    auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar6._0_8_ = uVar1;
    auVar6._12_4_ = DAT_0030e0c0._4_4_;
    fVar4 = (float)((double)in_XMM3_Da *
                   (-2.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44((int)DAT_0030e0c0,(int)uVar1) - 4503599627370496.0))));
    if (*(long *)(*(long *)(in_RDI + 0x50) + 0x38) == 0) {
      plVar2 = *(long **)(*(long *)(in_RDI + 0x50) + 0x30);
      (**(code **)(*plVar2 + 0x30))
                ((double)in_XMM0_Da,(double)in_XMM1_Da,(double)fVar3,(double)fVar4,plVar2,in_RSI);
    }
    else {
      plVar2 = *(long **)(*(long *)(in_RDI + 0x50) + 0x38);
      (**(code **)(*plVar2 + 0x20))((double)fVar3,(double)fVar4,plVar2,in_RSI);
    }
  }
  return;
}

Assistant:

void Application::dragSelection(float x, float y, float dx, float dy,
                                const Matrix4x4 &modelViewProj) {
  if (scene->selected.object == nullptr) return;

  dx *= 2. / screenW;
  dy *= -2. / screenH;

  if (scene->selected.element) {
    scene->selected.element->translate(dx, dy, modelViewProj);
  } else {
    scene->selected.object->drag(x, y, dx, dy, modelViewProj);
  }
}